

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vc1StreamReader.cpp
# Opt level: O0

int __thiscall
VC1StreamReader::getNextBFrames(VC1StreamReader *this,uint8_t *buffer,int64_t *bTiming)

{
  int iVar1;
  long local_c0;
  long local_a0;
  int64_t pcrIncVal;
  undefined1 local_88 [8];
  VC1Frame frame;
  uint8_t *puStack_38;
  VC1Code vc1Code;
  uint8_t *nal;
  int bFrameCnt;
  int64_t *bTiming_local;
  uint8_t *buffer_local;
  VC1StreamReader *this_local;
  
  nal._4_4_ = 0;
  *bTiming = 0;
  puStack_38 = VC1Unit::findNextMarker
                         (buffer,(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd)
  ;
  do {
    if ((this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd + -4 <= puStack_38) {
LAB_0037337b:
      if (((this->super_MPEGStreamReader).m_eof & 1U) == 0) {
        this_local._4_4_ = 0xffffffff;
      }
      else {
        this_local._4_4_ = nal._4_4_;
      }
      return this_local._4_4_;
    }
    frame.rptfrmBitPos = (int)puStack_38[3];
    if ((frame.rptfrmBitPos == 0xd) || (frame.rptfrmBitPos == 0x1d)) {
      VC1Frame::VC1Frame((VC1Frame *)local_88);
      iVar1 = VC1Frame::decode_frame_direct
                        ((VC1Frame *)local_88,&this->m_sequence,puStack_38 + 4,
                         (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd);
      if (iVar1 == 0) {
        if ((frame.super_VC1Unit.m_nalBufferLen._4_4_ == 0) ||
           (frame.super_VC1Unit.m_nalBufferLen._4_4_ == 1)) {
          this_local._4_4_ = nal._4_4_;
          pcrIncVal._0_4_ = 1;
        }
        else {
          nal._4_4_ = nal._4_4_ + 1;
          local_a0 = (this->super_MPEGStreamReader).m_pcrIncPerFrame;
          if ((this->m_sequence).pulldown != 0) {
            if ((((this->m_sequence).interlace & 1U) == 0) || ((this->m_sequence).psf != 0)) {
              local_a0 = local_a0 * ((ulong)(byte)frame.fcm + 1);
            }
            else {
              if (frame._56_4_ == 0) {
                local_c0 = 0;
              }
              else {
                local_c0 = (this->super_MPEGStreamReader).m_pcrIncPerField;
              }
              local_a0 = local_c0 + local_a0;
            }
          }
          *bTiming = local_a0 + *bTiming;
          if (nal._4_4_ == (this->m_sequence).max_b_frames) {
            pcrIncVal._0_4_ = 1;
            this_local._4_4_ = nal._4_4_;
          }
          else {
            pcrIncVal._0_4_ = 0;
          }
        }
      }
      else {
        pcrIncVal._0_4_ = 2;
      }
      VC1Frame::~VC1Frame((VC1Frame *)local_88);
      if ((int)pcrIncVal != 0) {
        if ((int)pcrIncVal == 1) {
          return this_local._4_4_;
        }
        goto LAB_0037337b;
      }
    }
    puStack_38 = VC1Unit::findNextMarker
                           (puStack_38 + 4,
                            (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd);
  } while( true );
}

Assistant:

int VC1StreamReader::getNextBFrames(uint8_t* buffer, int64_t& bTiming) const
{
    int bFrameCnt = 0;
    bTiming = 0;
    for (uint8_t* nal = VC1Unit::findNextMarker(buffer, m_bufEnd); nal < m_bufEnd - 4;
         nal = VC1Unit::findNextMarker(nal + 4, m_bufEnd))
    {
        const auto vc1Code = static_cast<VC1Code>(nal[3]);
        if (vc1Code == VC1Code::FRAME || vc1Code == VC1Code::USER_FRAME)
        {
            VC1Frame frame;
            if (frame.decode_frame_direct(m_sequence, nal + 4, m_bufEnd) != 0)
                break;
            if (frame.pict_type == VC1PictType::I_TYPE || frame.pict_type == VC1PictType::P_TYPE)
                return bFrameCnt;
            bFrameCnt++;

            int64_t pcrIncVal = m_pcrIncPerFrame;

            if (m_sequence.pulldown)
            {
                if (!m_sequence.interlace || m_sequence.psf)
                {
                    pcrIncVal = pcrIncVal * (static_cast<int64_t>(frame.rptfrm) + 1);
                }
                else
                {
                    pcrIncVal += (frame.rff ? m_pcrIncPerField : 0);
                }
            }
            bTiming += pcrIncVal;

            if (bFrameCnt == m_sequence.max_b_frames)
                return bFrameCnt;
        }
    }
    if (m_eof)
    {
        return bFrameCnt;
    }
    return -1;
}